

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GUFA.cpp
# Opt level: O0

bool __thiscall
wasm::anon_unknown_174::GUFAOptimizer::addNewCasts(GUFAOptimizer *this,Function *func)

{
  undefined8 uVar1;
  bool bVar2;
  Module *pMVar3;
  ReFinalize local_280;
  undefined1 local_108 [8];
  Adder adder;
  Function *func_local;
  GUFAOptimizer *this_local;
  
  adder._224_8_ = func;
  pMVar3 = Walker<wasm::(anonymous_namespace)::GUFAOptimizer,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::GUFAOptimizer,_void>_>
           ::getModule(&(this->
                        super_WalkerPass<wasm::PostWalker<wasm::(anonymous_namespace)::GUFAOptimizer,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::GUFAOptimizer,_void>_>_>
                        ).
                        super_PostWalker<wasm::(anonymous_namespace)::GUFAOptimizer,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::GUFAOptimizer,_void>_>
                        .
                        super_Walker<wasm::(anonymous_namespace)::GUFAOptimizer,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::GUFAOptimizer,_void>_>
                      );
  bVar2 = FeatureSet::hasGC(&pMVar3->features);
  if (bVar2) {
    wasm::(anonymous_namespace)::GUFAOptimizer::addNewCasts(wasm::Function*)::Adder::Adder(wasm::
    (anonymous)::GUFAOptimizer__
              ((Walker<Adder,_wasm::UnifiedExpressionVisitor<Adder,_void>_> *)local_108,this);
    uVar1 = adder._224_8_;
    pMVar3 = Walker<wasm::(anonymous_namespace)::GUFAOptimizer,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::GUFAOptimizer,_void>_>
             ::getModule(&(this->
                          super_WalkerPass<wasm::PostWalker<wasm::(anonymous_namespace)::GUFAOptimizer,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::GUFAOptimizer,_void>_>_>
                          ).
                          super_PostWalker<wasm::(anonymous_namespace)::GUFAOptimizer,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::GUFAOptimizer,_void>_>
                          .
                          super_Walker<wasm::(anonymous_namespace)::GUFAOptimizer,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::GUFAOptimizer,_void>_>
                        );
    Walker<Adder,_wasm::UnifiedExpressionVisitor<Adder,_void>_>::walkFunctionInModule
              ((Walker<Adder,_wasm::UnifiedExpressionVisitor<Adder,_void>_> *)local_108,
               (Function *)uVar1,pMVar3);
    this_local._7_1_ = ((byte)adder.parent & 1) != 0;
    if (this_local._7_1_) {
      ReFinalize::ReFinalize(&local_280);
      uVar1 = adder._224_8_;
      pMVar3 = Walker<wasm::(anonymous_namespace)::GUFAOptimizer,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::GUFAOptimizer,_void>_>
               ::getModule(&(this->
                            super_WalkerPass<wasm::PostWalker<wasm::(anonymous_namespace)::GUFAOptimizer,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::GUFAOptimizer,_void>_>_>
                            ).
                            super_PostWalker<wasm::(anonymous_namespace)::GUFAOptimizer,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::GUFAOptimizer,_void>_>
                            .
                            super_Walker<wasm::(anonymous_namespace)::GUFAOptimizer,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::GUFAOptimizer,_void>_>
                          );
      Walker<wasm::ReFinalize,_wasm::OverriddenVisitor<wasm::ReFinalize,_void>_>::
      walkFunctionInModule
                (&local_280.
                  super_WalkerPass<wasm::PostWalker<wasm::ReFinalize,_wasm::OverriddenVisitor<wasm::ReFinalize,_void>_>_>
                  .
                  super_PostWalker<wasm::ReFinalize,_wasm::OverriddenVisitor<wasm::ReFinalize,_void>_>
                  .super_Walker<wasm::ReFinalize,_wasm::OverriddenVisitor<wasm::ReFinalize,_void>_>,
                 (Function *)uVar1,pMVar3);
      ReFinalize::~ReFinalize(&local_280);
    }
    addNewCasts::Adder::~Adder((Adder *)local_108);
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool addNewCasts(Function* func) {
    // Subtyping and casts only make sense if GC is enabled.
    if (!getModule()->features.hasGC()) {
      return false;
    }

    struct Adder : public PostWalker<Adder, UnifiedExpressionVisitor<Adder>> {
      GUFAOptimizer& parent;

      Adder(GUFAOptimizer& parent) : parent(parent) {}

      bool optimized = false;

      void visitExpression(Expression* curr) {
        if (!curr->type.isRef()) {
          // Ignore anything we cannot infer a type for.
          return;
        }

        auto oracleType = parent.getContents(curr).getType();
        // Exact casts are only allowed when custom descriptors is enabled.
        oracleType =
          oracleType.withInexactIfNoCustomDescs(getModule()->features);
        if (oracleType.isRef() && oracleType != curr->type &&
            Type::isSubType(oracleType, curr->type)) {
          replaceCurrent(Builder(*getModule()).makeRefCast(curr, oracleType));
          optimized = true;
        }
      }
    };

    Adder adder(*this);
    adder.walkFunctionInModule(func, getModule());
    if (adder.optimized) {
      ReFinalize().walkFunctionInModule(func, getModule());
      return true;
    }
    return false;
  }